

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularStringView::GenerateAccessorDeclarations
          (SingularStringView *this,Printer *p)

{
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> in_R9;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v2;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v1;
  pointer local_148;
  pointer local_140;
  undefined1 local_138 [24];
  undefined1 local_120 [24];
  undefined1 local_108 [17];
  undefined7 uStack_f7;
  _Alloc_hider _Stack_f0;
  undefined1 local_e8 [16];
  code *local_d8;
  code *local_d0;
  undefined1 local_c8 [112];
  char local_58;
  undefined8 local_50;
  char *local_48;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  local_40;
  
  local_120._0_8_ = 0;
  local_120._8_8_ = (long)" \t" + 2;
  local_138._16_8_ = p;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)local_108,(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)local_120,
                     (Span<const_std::basic_string_view<char,_std::char_traits<char>_>_>)ZEXT816(1),
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars.len_ = ((long)(local_108._8_8_ - local_108._0_8_) >> 3) * -0x2c8590b21642c859;
  vars.ptr_ = (pointer)local_108._0_8_;
  io::Printer::WithDefs(&local_40,p,vars,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_108);
  local_50 = 4;
  local_48 = "set_";
  prefixes.len_ = 0x100000001;
  prefixes.ptr_ = (pointer)0x1;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)local_108,(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)&local_50,prefixes,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars_00.len_ = ((long)(local_108._8_8_ - local_108._0_8_) >> 3) * -0x2c8590b21642c859;
  vars_00.ptr_ = (pointer)local_108._0_8_;
  io::Printer::WithDefs
            ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
              *)local_120,p,vars_00,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_108);
  local_148 = (pointer)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"donated","");
  local_108._0_8_ = local_108 + 0x10;
  if (local_148 == (pointer)local_138) {
    _Stack_f0._M_p = (pointer)local_138._8_8_;
  }
  else {
    local_108._0_8_ = local_148;
  }
  stack0xffffffffffffff08 = (pointer)CONCAT71(local_138._1_7_,local_138[0]);
  local_108._8_8_ = local_140;
  local_140 = (pointer)0x0;
  local_138[0] = 0;
  local_148 = (pointer)local_138;
  local_e8._0_8_ = operator_new(0x18);
  *(SingularStringView **)local_e8._0_8_ = this;
  *(undefined1 **)(local_e8._0_8_ + 8) = local_138 + 0x10;
  *(undefined1 *)(local_e8._0_8_ + 0x10) = 0;
  local_d0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  local_e8._8_8_ = 0;
  local_d8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_c8[0] = 1;
  local_c8._16_8_ = (pointer)0x0;
  local_c8[0x18] = 0;
  local_c8[0x28] = 0;
  local_c8._8_8_ = local_c8 + 0x18;
  std::__cxx11::string::_M_replace((ulong)(local_c8 + 8),0,(char *)0x0,0x361ff2);
  local_58 = '\0';
  google::protobuf::io::Printer::Emit
            (p,local_108,1,0x173,
             "\n        $DEPRECATED$ absl::string_view $name$() const;\n        template <typename Arg_ = std::string&&>\n        $DEPRECATED$ void $set_name$(Arg_&& arg);\n\n        private:\n        const std::string& _internal_$name$() const;\n        inline PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(\n            absl::string_view value);\n        $donated$;\n\n        public:\n      "
            );
  if (local_58 == '\x01') {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
               (local_c8 + 0x30));
  }
  if ((undefined1 *)local_c8._8_8_ != local_c8 + 0x18) {
    operator_delete((void *)local_c8._8_8_,CONCAT71(local_c8._25_7_,local_c8[0x18]) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[(byte)local_c8[0]]._M_data)
            ((anon_class_1_0_00000001 *)&local_50,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)local_e8);
  local_c8[0] = 0xff;
  if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_,
                    (ulong)((long)&(stack0xffffffffffffff08->key_)._M_dataplus._M_p + 1));
  }
  if (local_148 != (pointer)local_138) {
    operator_delete(local_148,CONCAT71(local_138._1_7_,local_138[0]) + 1);
  }
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
              *)local_120);
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_40);
  return;
}

Assistant:

void SingularStringView::GenerateAccessorDeclarations(io::Printer* p) const {
  auto v1 = p->WithVars(AnnotatedAccessors(field_, {""}));
  auto v2 = p->WithVars(
      AnnotatedAccessors(field_, {"set_"}, AnnotationCollector::kSet));

  p->Emit(
      {{"donated",
        [&] {
          if (!is_inlined()) return;
          p->Emit(R"cc(
            inline PROTOBUF_ALWAYS_INLINE bool _internal_$name$_donated() const;
          )cc");
        }}},
      R"cc(
        $DEPRECATED$ absl::string_view $name$() const;
        template <typename Arg_ = std::string&&>
        $DEPRECATED$ void $set_name$(Arg_&& arg);

        private:
        const std::string& _internal_$name$() const;
        inline PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(
            absl::string_view value);
        $donated$;

        public:
      )cc");
}